

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCallExpr(BinaryReaderIR *this,Index func_index)

{
  Result RVar1;
  pointer *__ptr;
  undefined1 local_98 [120];
  
  GetLocation((Location *)(local_98 + 0x10),this);
  Var::Var((Var *)(local_98 + 0x30),func_index,(Location *)(local_98 + 0x10));
  std::make_unique<wabt::VarExpr<(wabt::ExprType)12>,wabt::Var>((Var *)local_98);
  local_98._8_8_ = local_98._0_8_;
  local_98._0_8_ = (long *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_98 + 8)
                    );
  if ((long *)local_98._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_98._8_8_ + 8))();
  }
  if ((long *)local_98._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_98._0_8_ + 8))();
  }
  local_98._0_8_ = 0;
  Var::~Var((Var *)(local_98 + 0x30));
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnCallExpr(Index func_index) {
  return AppendExpr(std::make_unique<CallExpr>(Var(func_index, GetLocation())));
}